

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_client.cc
# Opt level: O0

int main(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  int iVar1;
  Builder<prometheus::Counter> *pBVar2;
  element_type *registry_00;
  Family<prometheus::Counter> *this;
  Counter *pCVar3;
  ostream *this_00;
  void *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4b0;
  int local_43c;
  int returnCode;
  allocator local_429;
  string local_428 [32];
  weak_ptr<prometheus::Collectable> local_408;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3f1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  iterator local_368;
  size_type local_360;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  Counter *local_328;
  Counter *second_counter;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  iterator local_2d0;
  size_type local_2c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  Builder<prometheus::Counter> local_240;
  Family<prometheus::Counter> *local_1d0;
  Family<prometheus::Counter> *counter_family;
  shared_ptr<prometheus::Registry> registry;
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  Gateway gateway;
  string local_60 [32];
  undefined1 local_40 [8];
  Labels labels;
  
  labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  GetHostName_abi_cxx11_();
  prometheus::Gateway::GetInstanceLabel((Labels *)local_40,local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"127.0.0.1",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"9091",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"sample_client",&local_169);
  std::__cxx11::string::string(local_190);
  std::__cxx11::string::string(local_1b0);
  registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  prometheus::Gateway::Gateway
            ((Gateway *)local_f8,(string *)local_118,(string *)local_140,(string *)local_168,
             (Labels *)local_40,(string *)local_190,(string *)local_1b0,(seconds)0x0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::make_shared<prometheus::Registry>();
  prometheus::BuildCounter();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"time_running_seconds_total",&local_261);
  pBVar2 = prometheus::detail::Builder<prometheus::Counter>::Name(&local_240,(string *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"How many seconds is this server running?",&local_289);
  pBVar2 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar2,(string *)local_288);
  local_318 = &local_310;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[6],_true>
            (local_318,(char (*) [6])0x152077,(char (*) [6])"value");
  local_2d0 = &local_310;
  local_2c8 = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&second_counter + 6));
  __l_00._M_len = local_2c8;
  __l_00._M_array = local_2d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_2c0,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&second_counter + 7),
        (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&second_counter + 6));
  pBVar2 = prometheus::detail::Builder<prometheus::Counter>::Labels(pBVar2,&local_2c0);
  registry_00 = std::
                __shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&counter_family);
  this = prometheus::detail::Builder<prometheus::Counter>::Register(pBVar2,registry_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_2c0);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&second_counter + 6));
  local_4b0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2d0;
  do {
    local_4b0 = local_4b0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_4b0);
  } while (local_4b0 != &local_310);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  prometheus::detail::Builder<prometheus::Counter>::~Builder(&local_240);
  local_3f0 = &local_3e8;
  local_1d0 = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[6],_true>
            (local_3f0,(char (*) [14])0x15206f,(char (*) [6])"value");
  local_3f0 = &local_3a8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[6],_true>
            (local_3f0,(char (*) [18])"yet_another_label",(char (*) [6])"value");
  local_368 = &local_3e8;
  local_360 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_3f2);
  __l._M_len = local_360;
  __l._M_array = local_368;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_358,__l,&local_3f1,&local_3f2);
  pCVar3 = prometheus::Family<prometheus::Counter>::Add<>(this,&local_358);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_358);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_3f2);
  local_4e0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_368;
  do {
    local_4e0 = local_4e0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_4e0);
  } while (local_4e0 != &local_3e8);
  local_328 = pCVar3;
  std::weak_ptr<prometheus::Collectable>::weak_ptr<prometheus::Registry,void>
            (&local_408,(shared_ptr<prometheus::Registry> *)&counter_family);
  prometheus::Gateway::RegisterCollectable((Gateway *)local_f8,&local_408,(Labels *)0x0);
  std::weak_ptr<prometheus::Collectable>::~weak_ptr(&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"Foo:foo",&local_429);
  prometheus::Gateway::AddHttpHeader((Gateway *)local_f8,(string *)local_428);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  do {
    local_43c = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&returnCode,&local_43c);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&returnCode);
    prometheus::Counter::Increment(local_328);
    iVar1 = prometheus::Gateway::Push((Gateway *)local_f8);
    this_00 = std::operator<<((ostream *)&std::cout,"returnCode is ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar1);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create a push gateway
  const auto labels = Gateway::GetInstanceLabel(GetHostName());

  Gateway gateway{"127.0.0.1", "9091", "sample_client", labels};

  // create a metrics registry with component=main labels applied to all its
  // metrics
  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Labels({{"label", "value"}})
                             .Register(*registry);

  // add a counter to the metric family
  auto& second_counter = counter_family.Add(
      {{"another_label", "value"}, {"yet_another_label", "value"}});

  // ask the pusher to push the metrics to the pushgateway
  gateway.RegisterCollectable(registry);

  // add custom HTTP header
  gateway.AddHttpHeader("Foo:foo");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counter by one (second)
    second_counter.Increment();

    // push metrics
    auto returnCode = gateway.Push();
    std::cout << "returnCode is " << returnCode << std::endl;
  }
  return 0;
}